

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O1

unsigned_long_long duckdb_zstd::ZSTD_decompressBound(void *src,size_t srcSize)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameSizeInfo local_40;
  
  uVar3 = 0;
  do {
    if (srcSize == 0) {
      return uVar3;
    }
    ZSTD_findFrameSizeInfo(&local_40,src,srcSize,ZSTD_f_zstd1);
    uVar2 = local_40.decompressedBound;
    uVar1 = local_40.compressedSize;
    if (local_40.compressedSize >= 0xffffffffffffff89 ||
        local_40.decompressedBound == 0xfffffffffffffffe) {
      uVar2 = 0;
      uVar1 = 0;
    }
    srcSize = srcSize - uVar1;
    uVar3 = uVar3 + uVar2;
    src = (void *)((long)src + uVar1);
  } while (local_40.compressedSize < 0xffffffffffffff89 &&
           local_40.decompressedBound != 0xfffffffffffffffe);
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize, ZSTD_f_zstd1);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}